

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeObject::~IfcTypeObject(IfcTypeObject *this)

{
  ~IfcTypeObject((IfcTypeObject *)&this[-1].field_0x70);
  return;
}

Assistant:

IfcTypeObject() : Object("IfcTypeObject") {}